

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall sznet::net::EventLoop::doPendingFunctors(EventLoop *this)

{
  bool bVar1;
  reference this_00;
  Functor *functor;
  iterator __end2;
  iterator __begin2;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *__range2;
  MutexLockGuard local_30;
  MutexLockGuard lock;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> functors;
  EventLoop *this_local;
  
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::vector
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)&lock);
  this->m_callingPendingFunctors = true;
  MutexLockGuard::MutexLockGuard(&local_30,&this->m_mutex);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::swap
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)&lock,
             &this->m_pendingFunctors);
  MutexLockGuard::~MutexLockGuard(&local_30);
  __end2 = std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::begin
                     ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                      &lock);
  functor = (Functor *)
            std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::end
                      ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                       &lock);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                                *)&functor);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
              ::operator*(&__end2);
    std::function<void_()>::operator()(this_00);
    __gnu_cxx::
    __normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
    ::operator++(&__end2);
  }
  this->m_callingPendingFunctors = false;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)&lock);
  return;
}

Assistant:

void EventLoop::doPendingFunctors()
{
	std::vector<Functor> functors;
	m_callingPendingFunctors = true;

	{
		MutexLockGuard lock(m_mutex);
		// 不是简单地在临界区依次调用Functor，而是把回调列表swap()到局部变量functors中，
		// 这样做，一方面减小了临界区的长度(不会阻塞其他线程调用queueInLoop())，
		// 另一方面避免了死锁(因为Functor可能再调用queueInLoop())。
		functors.swap(m_pendingFunctors);
	}

	for (const Functor& functor : functors)
	{
		functor();
	}

	m_callingPendingFunctors = false;
}